

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structurally_valid.cc
# Opt level: O0

int google::protobuf::internal::UTF8GenericScan
              (UTF8ScanObj *st,char *str,int str_length,int *bytes_consumed)

{
  int iVar1;
  uint8 *puVar2;
  byte *pbVar3;
  byte *pbVar4;
  uint8 *puVar5;
  int *in_RCX;
  int in_EDX;
  byte *in_RSI;
  UTF8ScanObj *in_RDI;
  bool bVar6;
  uint8 *Tbl;
  int e0123;
  uint32 temp;
  uint32 s4567;
  uint32 s0123;
  uint32 hiadd;
  uint32 losub;
  uint8 *Tbl2;
  uint8 c;
  int e;
  uint8 *Tbl_0;
  uint8 *srclimit8;
  uint8 *srclimit;
  uint8 *src;
  uint8 *isrc;
  int eshift;
  uint8 *local_88;
  uint local_5c;
  byte *local_40;
  
  *in_RCX = 0;
  if (in_EDX == 0) {
    return 0xf1;
  }
  iVar1 = in_RDI->entry_shift;
  pbVar4 = in_RSI + in_EDX;
  puVar5 = in_RDI->state_table + in_RDI->state0;
  local_40 = in_RSI;
LAB_005f4ba6:
  local_5c = 0;
  puVar2 = in_RDI->fast_state;
  while( true ) {
    bVar6 = false;
    if ((((ulong)local_40 & 7) != 0) && (bVar6 = false, local_40 < pbVar4)) {
      bVar6 = puVar2[*local_40] == '\0';
    }
    if (!bVar6) break;
    local_40 = local_40 + 1;
  }
  local_88 = puVar5;
  pbVar3 = local_40;
  if (((ulong)local_40 & 7) == 0) {
    do {
      do {
        local_40 = pbVar3;
        if (pbVar4 + -7 <= local_40) goto LAB_005f4da4;
        pbVar3 = local_40 + 8;
      } while (((*(int *)local_40 - in_RDI->losub | *(int *)local_40 + in_RDI->hiadd |
                 *(int *)(local_40 + 4) - in_RDI->losub | *(int *)(local_40 + 4) + in_RDI->hiadd) &
               0x80808080) == 0);
      if ((puVar2[*local_40] != '\0' || puVar2[local_40[1]] != '\0') ||
          (puVar2[local_40[2]] != '\0' || puVar2[local_40[3]] != '\0')) goto LAB_005f4da4;
    } while ((puVar2[local_40[4]] == '\0' && puVar2[local_40[5]] == '\0') &&
             (puVar2[local_40[6]] == '\0' && puVar2[local_40[7]] == '\0'));
    local_40 = local_40 + 4;
  }
LAB_005f4da4:
  do {
    if (pbVar4 <= local_40) break;
    local_5c = (uint)local_88[*local_40];
    local_40 = local_40 + 1;
    if (0xef < local_5c) break;
    local_88 = puVar5 + (int)(local_5c << ((byte)iVar1 & 0x1f));
  } while( true );
  if (local_5c < 0xf0) {
    bVar6 = InStateZero(in_RDI,local_88);
    if (bVar6) {
      local_5c = 0xf1;
    }
    else {
      local_5c = 0xf0;
      do {
        local_40 = local_40 + -1;
        bVar6 = false;
        if (in_RSI < local_40) {
          bVar6 = (*local_40 & 0xc0) == 0x80;
        }
      } while (bVar6);
    }
  }
  else {
    local_40 = local_40 + -1;
    bVar6 = InStateZero(in_RDI,local_88);
    if (!bVar6) {
      do {
        local_40 = local_40 + -1;
        bVar6 = false;
        if (in_RSI < local_40) {
          bVar6 = (*local_40 & 0xc0) == 0x80;
        }
      } while (bVar6);
    }
  }
  if (local_5c != 0xfd) {
    *in_RCX = (int)local_40 - (int)in_RSI;
    return local_5c;
  }
  goto LAB_005f4ba6;
}

Assistant:

int UTF8GenericScan(const UTF8ScanObj* st,
                    const char * str,
                    int str_length,
                    int* bytes_consumed) {
  *bytes_consumed = 0;
  if (str_length == 0) return kExitOK;

  int eshift = st->entry_shift;
  const uint8* isrc = reinterpret_cast<const uint8*>(str);
  const uint8* src = isrc;
  const uint8* srclimit = isrc + str_length;
  const uint8* srclimit8 = srclimit - 7;
  const uint8* Tbl_0 = &st->state_table[st->state0];

 DoAgain:
  // Do state-table scan
  int e = 0;
  uint8 c;
  const uint8* Tbl2 = &st->fast_state[0];
  const uint32 losub = st->losub;
  const uint32 hiadd = st->hiadd;
  // Check initial few bytes one at a time until 8-byte aligned
  //----------------------------
  while ((((uintptr_t)src & 0x07) != 0) &&
         (src < srclimit) &&
         Tbl2[src[0]] == 0) {
    src++;
  }
  if (((uintptr_t)src & 0x07) == 0) {
    // Do fast for groups of 8 identity bytes.
    // This covers a lot of 7-bit ASCII ~8x faster then the 1-byte loop,
    // including slowing slightly on cr/lf/ht
    //----------------------------
    while (src < srclimit8) {
      uint32 s0123 = (reinterpret_cast<const uint32 *>(src))[0];
      uint32 s4567 = (reinterpret_cast<const uint32 *>(src))[1];
      src += 8;
      // This is a fast range check for all bytes in [lowsub..0x80-hiadd)
      uint32 temp = (s0123 - losub) | (s0123 + hiadd) |
                    (s4567 - losub) | (s4567 + hiadd);
      if ((temp & 0x80808080) != 0) {
        // We typically end up here on cr/lf/ht; src was incremented
        int e0123 = (Tbl2[src[-8]] | Tbl2[src[-7]]) |
                    (Tbl2[src[-6]] | Tbl2[src[-5]]);
        if (e0123 != 0) {
          src -= 8;
          break;
        }    // Exit on Non-interchange
        e0123 = (Tbl2[src[-4]] | Tbl2[src[-3]]) |
                (Tbl2[src[-2]] | Tbl2[src[-1]]);
        if (e0123 != 0) {
          src -= 4;
          break;
        }    // Exit on Non-interchange
        // Else OK, go around again
      }
    }
  }
  //----------------------------

  // Byte-at-a-time scan
  //----------------------------
  const uint8* Tbl = Tbl_0;
  while (src < srclimit) {
    c = *src;
    e = Tbl[c];
    src++;
    if (e >= kExitIllegalStructure) {break;}
    Tbl = &Tbl_0[e << eshift];
  }
  //----------------------------


  // Exit posibilities:
  //  Some exit code, !state0, back up over last char
  //  Some exit code, state0, back up one byte exactly
  //  source consumed, !state0, back up over partial char
  //  source consumed, state0, exit OK
  // For illegal byte in state0, avoid backup up over PREVIOUS char
  // For truncated last char, back up to beginning of it

  if (e >= kExitIllegalStructure) {
    // Back up over exactly one byte of rejected/illegal UTF-8 character
    src--;
    // Back up more if needed
    if (!InStateZero(st, Tbl)) {
      do {
        src--;
      } while ((src > isrc) && ((src[0] & 0xc0) == 0x80));
    }
  } else if (!InStateZero(st, Tbl)) {
    // Back up over truncated UTF-8 character
    e = kExitIllegalStructure;
    do {
      src--;
    } while ((src > isrc) && ((src[0] & 0xc0) == 0x80));
  } else {
    // Normal termination, source fully consumed
    e = kExitOK;
  }

  if (e == kExitDoAgain) {
    // Loop back up to the fast scan
    goto DoAgain;
  }

  *bytes_consumed = src - isrc;
  return e;
}